

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UnaryOperatorWrapper,duckdb::AbsOperator>
               (hugeint_t *ldata,hugeint_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar3;
  uint64_t uVar4;
  int64_t iVar5;
  hugeint_t *phVar6;
  ulong uVar7;
  bool bVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  hugeint_t hVar13;
  hugeint_t hVar14;
  hugeint_t hVar15;
  hugeint_t zero;
  hugeint_t local_88;
  hugeint_t *local_78;
  idx_t local_70;
  ValidityMask *local_68;
  ulong local_60;
  hugeint_t *local_58;
  hugeint_t local_50;
  ulong local_40;
  ulong local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_78 = result_data;
  local_68 = mask;
  local_58 = ldata;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar11 = 0;
      do {
        puVar1 = (uint64_t *)((long)&local_58->lower + lVar11);
        local_88.lower = *puVar1;
        local_88.upper = puVar1[1];
        hugeint_t::hugeint_t(&local_50,0);
        bVar8 = hugeint_t::operator<(&local_88,&local_50);
        if (bVar8) {
          hVar13 = hugeint_t::operator-(&local_88);
        }
        else {
          hVar13.upper = local_88.upper;
          hVar13.lower = local_88.lower;
        }
        *(uint64_t *)((long)&local_78->lower + lVar11) = hVar13.lower;
        *(int64_t *)((long)&local_78->upper + lVar11) = hVar13.upper;
        lVar11 = lVar11 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    local_70 = count;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_50.lower = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_88,(unsigned_long **)mask,&local_50.lower);
      iVar5 = local_88.upper;
      uVar4 = local_88.lower;
      local_88.lower = 0;
      local_88.upper = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar4;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar5;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.upper !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.upper);
      }
      pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar9->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      count = local_70;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_40 = count + 0x3f >> 6;
      uVar10 = 0;
      local_60 = 0;
      do {
        phVar6 = local_78;
        puVar2 = (local_68->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar12 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar12 = count;
          }
LAB_00fd0bfd:
          uVar7 = uVar10;
          if (uVar10 < uVar12) {
            lVar11 = uVar10 << 4;
            do {
              puVar1 = (uint64_t *)((long)&local_58->lower + lVar11);
              local_88.lower = *puVar1;
              local_88.upper = puVar1[1];
              hugeint_t::hugeint_t(&local_50,0);
              bVar8 = hugeint_t::operator<(&local_88,&local_50);
              if (bVar8) {
                hVar14 = hugeint_t::operator-(&local_88);
              }
              else {
                hVar14.upper = local_88.upper;
                hVar14.lower = local_88.lower;
              }
              *(uint64_t *)((long)&phVar6->lower + lVar11) = hVar14.lower;
              *(int64_t *)((long)&phVar6->upper + lVar11) = hVar14.upper;
              uVar10 = uVar10 + 1;
              lVar11 = lVar11 + 0x10;
              count = local_70;
              uVar7 = uVar12;
            } while (uVar12 != uVar10);
          }
        }
        else {
          uVar3 = puVar2[local_60];
          uVar12 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar12 = count;
          }
          uVar7 = uVar12;
          if (uVar3 != 0) {
            if (uVar3 == 0xffffffffffffffff) goto LAB_00fd0bfd;
            local_38 = uVar12 - uVar10;
            uVar7 = uVar10;
            if (uVar10 <= uVar12 && local_38 != 0) {
              lVar11 = uVar10 << 4;
              uVar10 = 0;
              do {
                if ((uVar3 >> (uVar10 & 0x3f) & 1) != 0) {
                  puVar1 = (uint64_t *)((long)&local_58->lower + lVar11);
                  local_88.lower = *puVar1;
                  local_88.upper = puVar1[1];
                  hugeint_t::hugeint_t(&local_50,0);
                  bVar8 = hugeint_t::operator<(&local_88,&local_50);
                  if (bVar8) {
                    hVar15 = hugeint_t::operator-(&local_88);
                  }
                  else {
                    hVar15.upper = local_88.upper;
                    hVar15.lower = local_88.lower;
                  }
                  *(uint64_t *)((long)&local_78->lower + lVar11) = hVar15.lower;
                  *(int64_t *)((long)&local_78->upper + lVar11) = hVar15.upper;
                }
                uVar10 = uVar10 + 1;
                lVar11 = lVar11 + 0x10;
                count = local_70;
                uVar7 = uVar12;
              } while (local_38 != uVar10);
            }
          }
        }
        uVar10 = uVar7;
        local_60 = local_60 + 1;
      } while (local_60 != local_40);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}